

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O0

void anon_unknown.dwarf_7d43e::nearlyOppositeVectors(void)

{
  ostream *this;
  float fVar1;
  V3f to;
  V3f from;
  int i;
  float e;
  Rand48 rand;
  V3f *in_stack_00000068;
  V3f *in_stack_00000070;
  Vec3<float> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar2;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  Rand48 *in_stack_ffffffffffffffd8;
  int local_10;
  
  this = std::operator<<((ostream *)&std::cout,"  nearly opposite from and to vectors");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (unsigned_long)in_stack_ffffffffffffffa8);
  fVar1 = Imath_2_5::limits<float>::epsilon();
  for (local_10 = 0; local_10 < 500000; local_10 = local_10 + 1) {
    Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(in_stack_ffffffffffffffd8)
    ;
    Imath_2_5::Vec3<float>::operator-(in_stack_ffffffffffffffa8);
    fVar2 = fVar1 * 100.0;
    Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(in_stack_ffffffffffffffd8)
    ;
    Imath_2_5::operator*
              (in_stack_ffffffffffffffbc,(Vec3<float> *)CONCAT44(in_stack_ffffffffffffffb4,fVar2));
    Imath_2_5::Vec3<float>::operator+
              ((Vec3<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (Vec3<float> *)CONCAT44(in_stack_ffffffffffffffb4,fVar2));
    testRotation(in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

void
nearlyOppositeVectors ()
{
    cout << "  nearly opposite from and to vectors" << endl;

    Rand48 rand (19);
    float e = 100 * limits<float>::epsilon();

    for (int i = 0; i < 500000; ++i)
    {
	V3f from = hollowSphereRand<V3f> (rand);
	V3f to = -from + e * hollowSphereRand<V3f> (rand);
	testRotation (from, to);
    }
}